

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O1

void __thiscall llama_model::load_arch(llama_model *this,llama_model_loader *ml)

{
  llm_arch lVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = llama_model_loader::get_arch(ml);
  this->arch = lVar1;
  if (lVar1 != LLM_ARCH_UNKNOWN) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  llama_model_loader::get_arch_name_abi_cxx11_(&local_60,ml);
  std::operator+(&local_40,"unknown model architecture: \'",&local_60);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_80 == plVar3) {
    local_70 = *plVar3;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar3;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void llama_model::load_arch(llama_model_loader & ml) {
    arch = ml.get_arch();
    if (arch == LLM_ARCH_UNKNOWN) {
        throw std::runtime_error("unknown model architecture: '" + ml.get_arch_name() + "'");
    }
}